

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_internal.c
# Opt level: O2

int http_send_error2(size_t error,intptr_t uuid,http_settings_s *settings)

{
  int iVar1;
  fio_protocol_s *pfVar2;
  http_s *r;
  void *pvVar3;
  FIOBJ FVar4;
  FIOBJ FVar5;
  timespec tVar6;
  
  if (((error == 0) || (uuid == 0)) || (settings == (http_settings_s *)0x0)) {
    iVar1 = -1;
  }
  else {
    pfVar2 = http1_new(uuid,settings,(void *)0x0,0);
    r = (http_s *)fio_malloc(0x80);
    if (pfVar2 == (fio_protocol_s *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/http_internal.c:101) Couldn\'t allocate response object for error report."
                      );
      }
      perror("     errno");
      exit(-1);
    }
    pvVar3 = http1_vtable();
    FVar4 = fiobj_hash_new();
    tVar6 = fio_last_tick();
    FVar5 = fiobj_hash_new();
    (r->private_data).vtbl = pvVar3;
    (r->private_data).flag = (uintptr_t)pfVar2;
    (r->private_data).out_headers = FVar4;
    r->received_at = tVar6;
    r->method = 0;
    r->status_str = 0;
    r->version = 0;
    r->status = 200;
    r->path = 0;
    r->query = 0;
    r->headers = FVar5;
    r->cookies = 0;
    r->params = 0;
    r->body = 0;
    r->udata = (void *)0x0;
    iVar1 = http_send_error(r,error);
    fio_close(uuid);
  }
  return iVar1;
}

Assistant:

int http_send_error2(size_t error, intptr_t uuid, http_settings_s *settings) {
  if (!uuid || !settings || !error)
    return -1;
  fio_protocol_s *pr = http1_new(uuid, settings, NULL, 0);
  http_s *r = fio_malloc(sizeof(*r));
  FIO_ASSERT(pr, "Couldn't allocate response object for error report.")
  http_s_new(r, (http_fio_protocol_s *)pr, http1_vtable());
  int ret = http_send_error(r, error);
  fio_close(uuid);
  return ret;
}